

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_CELL local_30;
  REF_CELL ref_cell;
  REF_INT map;
  REF_INT edge;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT group;
  REF_SUBDIV ref_subdiv_local;
  
  cell_edge = 8;
  local_30 = ref_subdiv->grid->cell[8];
  while (cell_edge < 0x10) {
    for (edge = 0; edge < local_30->max; edge = edge + 1) {
      if (((-1 < edge) && (edge < local_30->max)) &&
         (local_30->c2n[local_30->size_per * edge] != -1)) {
        uVar1 = ref_subdiv_map(ref_subdiv,local_30,edge);
        printf(" group %d cell %d map %d\n",(ulong)(uint)cell_edge,(ulong)(uint)edge,(ulong)uVar1);
        for (map = 0; map < local_30->edge_per; map = map + 1) {
          uVar1 = ref_subdiv_c2e(ref_subdiv,local_30,map,edge);
          printf("  edge %d nodes %d %d mark %d\n",(ulong)uVar1,
                 (ulong)(uint)local_30->c2n[local_30->e2n[map << 1] + local_30->size_per * edge],
                 (ulong)(uint)local_30->c2n[local_30->e2n[map * 2 + 1] + local_30->size_per * edge],
                 (ulong)(uint)ref_subdiv->mark[(int)uVar1]);
        }
      }
    }
    cell_edge = cell_edge + 1;
    local_30 = ref_subdiv->grid->cell[cell_edge];
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, cell_edge, edge, map;
  REF_CELL ref_cell;

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
      printf(" group %d cell %d map %d\n", group, cell, map);
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        edge = ref_subdiv_c2e(ref_subdiv, ref_cell, cell_edge, cell);
        printf("  edge %d nodes %d %d mark %d\n", edge,
               ref_cell_e2n(ref_cell, 0, cell_edge, cell),
               ref_cell_e2n(ref_cell, 1, cell_edge, cell),
               ref_subdiv_mark(ref_subdiv, edge));
      }
    }
  }
  return REF_SUCCESS;
}